

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O3

void __thiscall
agge::renderer::operator()
          (renderer *this,bitmap<unsigned_short,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window,
          mask_full<8UL> *mask,blender<unsigned_short,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  int iVar1;
  pointer puVar2;
  cell *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t *__s;
  uint8_t *puVar8;
  long lVar9;
  cell *pcVar10;
  uint uVar11;
  long lVar12;
  cell *pcVar13;
  uint8_t uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int y;
  uint8_t *puVar18;
  uint length;
  int iVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  scanline_cells sVar24;
  int local_80;
  int local_7c;
  int local_74;
  int local_68;
  
  iVar19 = offset.dx;
  local_80 = bitmap_->_width + iVar19;
  iVar16 = offset.dy;
  local_68 = bitmap_->_height + iVar16;
  local_7c = iVar16;
  local_74 = iVar19;
  if (window != (rect_i *)0x0) {
    local_74 = window->x1;
    if (window->x1 <= iVar19) {
      local_74 = iVar19;
    }
    local_7c = window->y1;
    if (window->y1 <= iVar16) {
      local_7c = iVar16;
    }
    if (window->x2 <= local_80) {
      local_80 = window->x2;
    }
    if (window->y2 <= local_68) {
      local_68 = window->y2;
    }
  }
  uVar23 = (mask->super_mask<8UL>)._width;
  uVar22 = uVar23 + 4;
  if ((this->_scanline_cache)._size < uVar22) {
    __s = (uint8_t *)operator_new__((ulong)uVar22);
    puVar8 = (this->_scanline_cache)._buffer;
    if (puVar8 != (uint8_t *)0x0) {
      operator_delete__(puVar8);
    }
    (this->_scanline_cache)._buffer = __s;
    (this->_scanline_cache)._size = uVar22;
    if (uVar23 < 0xfffffffc) {
      memset(__s,0,(ulong)uVar22);
    }
    else {
      *__s = '\0';
      if (uVar22 < 2) {
        puVar8 = __s + 1;
      }
      else {
        __s[1] = '\0';
        if (uVar22 == 2) goto LAB_00173255;
        puVar8 = __s + 2;
      }
      *puVar8 = '\0';
    }
  }
  else {
    __s = (this->_scanline_cache)._buffer;
  }
LAB_00173255:
  iVar1 = (mask->super_mask<8UL>)._height;
  if (0 < iVar1) {
    y = (mask->super_mask<8UL>)._min_y;
    iVar1 = iVar1 + y;
    lVar9 = (long)iVar19;
    do {
      sVar24 = tests::mocks::mask<8UL>::operator[](&mask->super_mask<8UL>,y);
      pcVar13 = sVar24.second;
      pcVar10 = sVar24.first;
      if ((local_7c <= y) && (y < local_68)) {
        lVar12 = (ulong)bitmap_->_width * (ulong)(uint)(y - iVar16);
        puVar2 = (bitmap_->data).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pcVar10 != pcVar13) {
          iVar19 = 0;
          iVar21 = 0;
          uVar22 = 0;
          puVar8 = __s;
LAB_001732ef:
          do {
            iVar17 = pcVar10->x;
            iVar4 = 0;
            pcVar3 = pcVar10;
            do {
              pcVar10 = pcVar3 + 1;
              iVar4 = iVar4 + pcVar3->area;
              uVar22 = uVar22 + pcVar3->cover;
              if (pcVar10 == pcVar13) break;
              pcVar3 = pcVar10;
            } while (pcVar10->x == iVar17);
            puVar18 = puVar8;
            if (iVar4 != 0) {
              iVar4 = (int)(uVar22 * 0x200 - iVar4) >> 9;
              if (0xfe < iVar4) {
                iVar4 = 0xff;
              }
              iVar7 = iVar21;
              if (iVar19 != iVar17) {
                iVar6 = iVar21;
                if (local_74 - iVar21 != 0 && iVar21 <= local_74) {
                  iVar6 = local_74;
                }
                iVar5 = -(local_74 - iVar21);
                iVar7 = 0;
                if (iVar21 < local_74) {
                  iVar7 = iVar5;
                }
                uVar15 = iVar7 + (iVar19 - iVar21);
                uVar23 = local_80 - iVar6;
                if ((int)uVar15 < local_80 - iVar6) {
                  uVar23 = uVar15;
                }
                puVar8 = __s;
                iVar19 = iVar17;
                iVar7 = iVar17;
                if (0 < (int)uVar23) {
                  lVar20 = -(long)iVar5;
                  if (local_74 <= iVar21) {
                    lVar20 = 0;
                  }
                  tests::mocks::blender<unsigned_short,_unsigned_char>::operator()
                            (blender,puVar2 + lVar12 + (iVar6 - lVar9),iVar6,y,uVar23,__s + lVar20);
                }
              }
              iVar19 = iVar19 + 1;
              *puVar8 = (uint8_t)iVar4;
              puVar18 = puVar8 + 1;
              iVar17 = iVar17 + 1;
              iVar21 = iVar7;
            }
            if (pcVar10 == pcVar13) goto LAB_001734f2;
            uVar23 = pcVar10->x - iVar17;
            puVar8 = puVar18;
            if ((uVar22 & 0x7fffff) != 0 && uVar23 != 0) {
              uVar15 = (int)(uVar22 * 0x200) >> 9;
              if (0xfe < (int)uVar15) {
                uVar15 = 0xff;
              }
              iVar4 = iVar21;
              if (iVar19 != iVar17) {
                iVar7 = iVar21;
                if (local_74 - iVar21 != 0 && iVar21 <= local_74) {
                  iVar7 = local_74;
                }
                iVar6 = -(local_74 - iVar21);
                iVar4 = 0;
                if (iVar21 < local_74) {
                  iVar4 = iVar6;
                }
                uVar11 = iVar4 + (iVar19 - iVar21);
                length = local_80 - iVar7;
                if ((int)uVar11 < local_80 - iVar7) {
                  length = uVar11;
                }
                puVar18 = __s;
                iVar19 = iVar17;
                iVar4 = iVar17;
                if (0 < (int)length) {
                  lVar20 = -(long)iVar6;
                  if (local_74 <= iVar21) {
                    lVar20 = 0;
                  }
                  tests::mocks::blender<unsigned_short,_unsigned_char>::operator()
                            (blender,puVar2 + lVar12 + (iVar7 - lVar9),iVar7,y,length,__s + lVar20);
                }
              }
              iVar21 = iVar4;
              iVar19 = iVar19 + uVar23;
              puVar8 = puVar18 + uVar23;
              uVar14 = (uint8_t)uVar15;
              if (3 < uVar23) {
                memset(puVar18,uVar15 & 0xff,(ulong)uVar23);
                goto LAB_001732ef;
              }
              *puVar18 = uVar14;
              if (uVar23 < 2) {
                puVar18 = puVar18 + 1;
              }
              else {
                puVar18[1] = uVar14;
                if (uVar23 == 2) goto LAB_001732ef;
                puVar18 = puVar18 + 2;
              }
              *puVar18 = uVar14;
            }
          } while( true );
        }
        iVar19 = 0;
        iVar21 = 0;
LAB_001734f2:
        iVar17 = iVar21;
        if (local_74 - iVar21 != 0 && iVar21 <= local_74) {
          iVar17 = local_74;
        }
        iVar7 = -(local_74 - iVar21);
        iVar4 = 0;
        if (iVar21 < local_74) {
          iVar4 = iVar7;
        }
        uVar23 = iVar4 + (iVar19 - iVar21);
        uVar22 = local_80 - iVar17;
        if ((int)uVar23 < local_80 - iVar17) {
          uVar22 = uVar23;
        }
        if (0 < (int)uVar22) {
          lVar20 = -(long)iVar7;
          if (local_74 <= iVar21) {
            lVar20 = 0;
          }
          tests::mocks::blender<unsigned_short,_unsigned_char>::operator()
                    (blender,puVar2 + lVar12 + (iVar17 - lVar9),iVar17,y,uVar22,__s + lVar20);
        }
      }
      y = y + 1;
    } while (y < iVar1);
  }
  return;
}

Assistant:

inline void renderer::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window, const MaskT &mask, const BlenderT &blender,
		const AlphaFn &alpha)
	{
		typedef adapter<BitmapT, BlenderT> rendition_adapter;

		rendition_adapter ra(bitmap_, offset, window, blender);
		scanline_adapter<rendition_adapter> scanline(ra, _scanline_cache, mask.width());

		render(scanline, mask, alpha, 0, 1);
	}